

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O3

void AddSimpleField(FMFieldList *FieldP,int *CountP,char *Name,char *Type,int ElementSize)

{
  int iVar1;
  char *pcVar2;
  FMFieldList p_Var3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)*CountP;
  p_Var3 = *FieldP;
  if (lVar5 == 0) {
    iVar4 = 0;
    if (p_Var3 == (FMFieldList)0x0) {
      p_Var3 = (FMFieldList)malloc(0x30);
      iVar4 = 0;
      iVar1 = 0;
      goto LAB_00118afe;
    }
  }
  else {
    iVar4 = p_Var3[lVar5 + -1].field_size;
    pcVar2 = strchr(p_Var3[lVar5 + -1].field_type,0x5b);
    iVar1 = 8;
    if (pcVar2 == (char *)0x0) {
      iVar1 = iVar4;
    }
    iVar4 = iVar1 + p_Var3[lVar5 + -1].field_offset + ElementSize + -1;
    iVar4 = iVar4 - iVar4 % ElementSize;
  }
  p_Var3 = (FMFieldList)realloc(p_Var3,lVar5 * 0x18 + 0x30);
  iVar1 = *CountP;
LAB_00118afe:
  *FieldP = p_Var3;
  *CountP = iVar1 + 1;
  pcVar2 = strdup(Name);
  p_Var3[iVar1].field_name = pcVar2;
  pcVar2 = strdup(Type);
  p_Var3[iVar1].field_type = pcVar2;
  p_Var3[iVar1].field_size = ElementSize;
  p_Var3[iVar1].field_offset = iVar4;
  p_Var3[(long)iVar1 + 1].field_name = (char *)0x0;
  p_Var3[(long)iVar1 + 1].field_type = (char *)0x0;
  p_Var3[(long)iVar1 + 1].field_size = 0;
  p_Var3[(long)iVar1 + 1].field_offset = 0;
  return;
}

Assistant:

static void AddSimpleField(FMFieldList *FieldP, int *CountP, const char *Name, const char *Type,
                           int ElementSize)
{
    int Offset = 0;
    FMFieldList Field;
    if (*CountP)
    {
        FMFieldList PriorField;
        PriorField = &((*FieldP)[(*CountP) - 1]);
        int PriorFieldSize = PriorField->field_size;
        if (strchr(PriorField->field_type, '['))
        {
            // really a pointer
            PriorFieldSize = sizeof(void *);
        }
        Offset = ((PriorField->field_offset + PriorFieldSize + ElementSize - 1) / ElementSize) *
                 ElementSize;
    }
    if (*FieldP)
        *FieldP = realloc(*FieldP, (*CountP + 2) * sizeof((*FieldP)[0]));
    else
        *FieldP = malloc((*CountP + 2) * sizeof((*FieldP)[0]));

    Field = &((*FieldP)[*CountP]);
    (*CountP)++;
    Field->field_name = strdup(Name);
    Field->field_type = strdup(Type);
    Field->field_size = ElementSize;
    Field->field_offset = Offset;
    Field++;
    Field->field_name = NULL;
    Field->field_type = NULL;
    Field->field_size = 0;
    Field->field_offset = 0;
}